

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

void __thiscall
TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZReference::TPZReference
          (TPZReference *this,TPZMatrix<std::complex<double>_> *pointer)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  memory_order __b;
  __integral_type in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  *in_RDI = 0;
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
  *in_RDI = in_RSI;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  *(undefined4 *)(in_RDI + 1) = 1;
  UNLOCK();
  return;
}

Assistant:

TPZReference(T *pointer)
        {
            fPointer = pointer;
            fCounter.store(1);
        }